

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.cpp
# Opt level: O1

TridiagonalMatrix * construct_matrix(TridiagonalMatrix *__return_storage_ptr__,int nx,int nt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_type __n;
  double dVar5;
  double dVar6;
  vec cs;
  vec bs;
  vec as;
  allocator_type local_79;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  value_type_conflict local_30;
  
  iVar2 = 2;
  do {
    iVar3 = iVar2;
    iVar2 = iVar3 * 2;
  } while (iVar3 < nx);
  __n = (size_type)(iVar3 + -1);
  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_48,__n,(value_type_conflict *)&local_60,(allocator_type *)&local_78);
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60,__n,(value_type_conflict *)&local_78,(allocator_type *)&local_30);
  local_30 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector(&local_78,__n,&local_30,&local_79);
  dVar6 = (0.7853981633974483 / (double)nx) * (0.7853981633974483 / (double)nx);
  dVar5 = -2.0 / dVar6 + -1.0 / (1.0 / (double)nt);
  dVar6 = 1.0 / dVar6;
  *local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = dVar5;
  *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = dVar6;
  uVar1 = nx - 2;
  if (3 < nx) {
    uVar4 = 1;
    do {
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar4] = dVar5;
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar4] = dVar6;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar4] = dVar6;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[(int)uVar1] = dVar5;
  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[(int)uVar1] = dVar6;
  TridiagonalMatrix::TridiagonalMatrix(__return_storage_ptr__,&local_48,&local_60,&local_78);
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

TridiagonalMatrix construct_matrix(int nx, int nt)
{
    int size = compute_linear_system_size(nx - 1);

    vec as(size, 1.0);
    vec bs(size, 0.0);
    vec cs(size, 0.0);

    double h = X / nx;
    double tau = T / nt;

    double a = - 1.0 / tau - 2.0 / (h * h);
    double b_and_c = 1.0 / (h * h);

    as[0] = a;
    cs[0] = b_and_c;
    for (int i = 1; i < nx - 2; i++)
    {
        as[i] = a;
        bs[i] = b_and_c;
        cs[i] = b_and_c;
    }
    as[nx - 2] = a;
    bs[nx - 2] = b_and_c;

    return TridiagonalMatrix(as, bs, cs);
}